

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c6bd0f::OptionBuilder::add(OptionBuilder *this,CoverageOptionSyntax *syntax)

{
  undefined1 *this_00;
  char *pcVar1;
  long lVar2;
  Scope *this_01;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  size_t __n;
  char *__s1;
  bool bVar8;
  int iVar9;
  uint64_t hash;
  Diagnostic *this_02;
  SourceLocation noteLocation;
  uint uVar10;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppVar11;
  ulong pos0;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>_>
  *pSVar15;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppVar16;
  undefined1 auVar17 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_c9;
  not_null<slang::syntax::ExpressionSyntax_*> *local_c8;
  string_view name;
  locator res;
  
  slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
  emplace_back<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
            (&(this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>,this->scope,
             syntax);
  name = slang::ast::CoverageOptionSetter::getName
                   ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ +
                    ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.len - 1
                    ));
  if (name._M_len != 0) {
    bVar8 = slang::ast::CoverageOptionSetter::isTypeOption
                      ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_
                       + ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.
                          len - 1));
    pSVar15 = &this->instNames;
    if (bVar8) {
      pSVar15 = &this->typeNames;
    }
    this_00 = &(pSVar15->super_Storage).field_0x68;
    local_c8 = &syntax->expr;
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00,
                      &name);
    pos0 = hash >> (pSVar15->field_0x70 & 0x3f);
    lVar2 = *(long *)&pSVar15->field_0x80;
    lVar12 = (hash & 0xff) * 4;
    cVar4 = (&UNK_0051605c)[lVar12];
    cVar5 = (&UNK_0051605d)[lVar12];
    cVar6 = (&UNK_0051605e)[lVar12];
    cVar7 = (&UNK_0051605f)[lVar12];
    __n = name._M_len;
    __s1 = name._M_str;
    uVar14 = 0;
    uVar13 = pos0;
    do {
      pcVar1 = (char *)(lVar2 + uVar13 * 0x10);
      auVar17[0] = -(*pcVar1 == cVar4);
      auVar17[1] = -(pcVar1[1] == cVar5);
      auVar17[2] = -(pcVar1[2] == cVar6);
      auVar17[3] = -(pcVar1[3] == cVar7);
      auVar17[4] = -(pcVar1[4] == cVar4);
      auVar17[5] = -(pcVar1[5] == cVar5);
      auVar17[6] = -(pcVar1[6] == cVar6);
      auVar17[7] = -(pcVar1[7] == cVar7);
      auVar17[8] = -(pcVar1[8] == cVar4);
      auVar17[9] = -(pcVar1[9] == cVar5);
      auVar17[10] = -(pcVar1[10] == cVar6);
      auVar17[0xb] = -(pcVar1[0xb] == cVar7);
      auVar17[0xc] = -(pcVar1[0xc] == cVar4);
      auVar17[0xd] = -(pcVar1[0xd] == cVar5);
      auVar17[0xe] = -(pcVar1[0xe] == cVar6);
      auVar17[0xf] = -(pcVar1[0xf] == cVar7);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar12 = *(long *)&pSVar15->field_0x88;
        do {
          uVar3 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          ppVar11 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
                     *)(lVar12 + uVar13 * 0x168 + (ulong)uVar3 * 0x18);
          bVar8 = __n == (ppVar11->first)._M_len;
          if (bVar8 && __n != 0) {
            iVar9 = bcmp(__s1,(ppVar11->first)._M_str,__n);
            bVar8 = iVar9 == 0;
          }
          if (bVar8) goto LAB_002c082d;
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if ((*(byte *)(uVar13 * 0x10 + lVar2 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      lVar12 = uVar13 + uVar14;
      uVar14 = uVar14 + 1;
      uVar13 = lVar12 + 1U & *(ulong *)&pSVar15->field_0x78;
    } while (uVar14 <= *(ulong *)&pSVar15->field_0x78);
    ppVar11 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
               *)0x0;
LAB_002c082d:
    ppVar16 = ppVar11;
    if (ppVar11 ==
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      if (*(ulong *)&pSVar15->field_0x98 < *(ulong *)&pSVar15->field_0x90) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                         *)this_00,(arrays_type *)&pSVar15->field_0x70,pos0,hash,&local_c9,&name,
                   local_c8);
        *(long *)&pSVar15->field_0x98 = *(long *)&pSVar15->field_0x98 + 1;
        ppVar16 = res.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                         *)this_00,hash,&local_c9,&name,local_c8);
        ppVar16 = res.p;
      }
    }
    if (ppVar11 !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      this_01 = this->scope;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_c8->ptr->super_SyntaxNode);
      this_02 = slang::ast::Scope::addDiag(this_01,(DiagCode)0x220006,sourceRange);
      slang::Diagnostic::operator<<(this_02,name);
      res._0_16_ = slang::syntax::SyntaxNode::getFirstToken(ppVar16->second);
      noteLocation = slang::parsing::Token::location((Token *)&res);
      slang::Diagnostic::addNote(this_02,(DiagCode)0xc0001,noteLocation);
    }
  }
  return;
}

Assistant:

void add(const CoverageOptionSyntax& syntax) {
        options.emplace_back(scope, syntax);

        if (auto name = options.back().getName(); !name.empty()) {
            auto names = options.back().isTypeOption() ? &typeNames : &instNames;
            auto [it, inserted] = names->emplace(name, syntax.expr);
            if (!inserted) {
                auto& diag = scope.addDiag(diag::CoverageOptionDup, syntax.expr->sourceRange());
                diag << name;
                diag.addNote(diag::NotePreviousUsage, it->second->getFirstToken().location());
            }
        }
    }